

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseData<QList<int>>::resolve<QList<int>>
          (PromiseData<QList<int>> *this,QList<int> *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int *piVar1;
  undefined8 *puVar2;
  QList<int> *__tmp;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_001359a0;
  piVar1 = (value->d).ptr;
  puVar2[2] = (value->d).d;
  puVar2[3] = piVar1;
  puVar2[4] = (value->d).size;
  (value->d).d = (Data *)0x0;
  (value->d).ptr = (int *)0x0;
  (value->d).size = 0;
  *(undefined8 **)(this + 0x58) = puVar2 + 2;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
  *(undefined8 **)(this + 0x60) = puVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::setSettled
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }